

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O1

bool __thiscall
CMeshClosestPointMapper::SeamTool::IntersectsSeams
          (SeamTool *this,int count,ON_3dPoint *pPts,double tolerance)

{
  ON_3dVector delta;
  double *a_min;
  double *a_max;
  ulong uVar1;
  ON__INT_PTR sr_id;
  ON_RTreeSearchResult sr;
  ON_BoundingBox bbox;
  ON__INT_PTR local_c0;
  ON_RTreeSearchResult local_b8;
  ON_BoundingBox local_a8;
  ON_3dPoint local_78;
  ON_3dPoint local_60;
  ON_3dVector local_48;
  
  uVar1 = (ulong)(uint)count;
  if (this->m_bProcessed == false) {
    Process(this);
  }
  ON_BoundingBox::ON_BoundingBox(&local_a8);
  if (0 < count) {
    do {
      ON_BoundingBox::Set(&local_a8,pPts,1);
      pPts = pPts + 1;
      uVar1 = uVar1 - 1;
    } while (uVar1 != 0);
  }
  ON_3dVector::ON_3dVector(&local_48,tolerance,tolerance,tolerance);
  delta.y = local_48.y;
  delta.x = local_48.x;
  delta.z = local_48.z;
  ON_BoundingBox::Expand(&local_a8,delta);
  local_b8.m_id = &local_c0;
  local_c0 = 0;
  local_b8.m_capacity = 1;
  local_b8.m_count = 0;
  ON_BoundingBox::Min(&local_a8);
  a_min = ON_3dPoint::operator_cast_to_double_(&local_60);
  ON_BoundingBox::Max(&local_a8);
  a_max = ON_3dPoint::operator_cast_to_double_(&local_78);
  ON_RTree::Search(&this->m_seamTree,a_min,a_max,&local_b8);
  return 0 < local_b8.m_count;
}

Assistant:

bool IntersectsSeams(int count, const ON_3dPoint* pPts, double tolerance) const
    {
      if (!m_bProcessed)
        Process();

      ON_BoundingBox bbox;
      for (int i = 0; i < count; i++)
      {
        bbox.Set(pPts[i], 1);
      }
      bbox.Expand(ON_3dVector(tolerance, tolerance, tolerance));
      ON__INT_PTR sr_id = 0;
      ON_RTreeSearchResult sr;
      memset(&sr, 0, sizeof(sr));
      sr.m_capacity = 1;
      sr.m_id = &sr_id;
      m_seamTree.Search(bbox.Min(), bbox.Max(), sr);
      if (sr.m_count > 0)
        return true;
      return false;
    }